

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O0

BoolExpr * BO_xor(List *ls)

{
  bool bVar1;
  ListStruct *pLVar2;
  int local_2c;
  BOOL odd_trues;
  BoolExprType answer;
  BoolExpr *ret;
  BoolExpr *subexpr;
  List *ls_local;
  
  local_2c = 0;
  bVar1 = false;
  ls_local = (List *)create_bool_expr(E_XOR,(BoolExpr *)0x0);
  subexpr = (BoolExpr *)ls;
  while (subexpr = *(BoolExpr **)subexpr, (List *)subexpr != (List *)0x0) {
    pLVar2 = (ListStruct *)make_boolean_expr((List *)subexpr);
    if (*(BoolExprType *)&pLVar2->cdr == E_TRUE) {
      bVar1 = (bool)(bVar1 ^ 1);
      if (local_2c == 1) {
        local_2c = 0;
      }
      else if (local_2c == 0) {
        local_2c = 1;
      }
      else {
        *(ListStruct **)&pLVar2->token = ls_local->car;
        ls_local->car = pLVar2;
      }
    }
    else if (*(BoolExprType *)&pLVar2->cdr != E_FALSE) {
      *(ListStruct **)&pLVar2->token = ls_local->car;
      ls_local->car = pLVar2;
      local_2c = 2;
    }
  }
  if (ls_local->car == (ListStruct *)0x0) {
    parse_error((List *)0x0,"xor takes arguments!\n");
    ls_local = (List *)&false_bool_expr;
  }
  else if (local_2c == 1) {
    ls_local = (List *)&true_bool_expr;
  }
  else if (local_2c == 0) {
    ls_local = (List *)&false_bool_expr;
  }
  else if ((*(BoolExprStruct **)&ls_local->car->token != (BoolExprStruct *)0x0) || (bVar1)) {
    if (bVar1) {
      pLVar2 = (ListStruct *)create_bool_expr(E_TRUE,(BoolExpr *)0x0);
      *(ListStruct **)&pLVar2->token = ls_local->car;
      ls_local->car = pLVar2;
    }
  }
  else {
    ls_local = ls_local->car;
  }
  return (BoolExpr *)ls_local;
}

Assistant:

static BoolExpr *
BO_xor (const List *ls)
{
  BoolExpr *subexpr, *ret;
  BoolExprType answer = E_FALSE;
  BOOL odd_trues = NO;

  ret = create_bool_expr (E_XOR, NULL);
  while ((ls = ls->cdr))
    {
      subexpr = make_boolean_expr (ls);
      if (subexpr->type == E_TRUE)
	{
	  odd_trues = !odd_trues;

	  if (answer == E_TRUE) answer = E_FALSE;
	  else if (answer == E_FALSE) answer = E_TRUE;
	  else
	    {
	      subexpr->next = ret->subexpr;
	      ret->subexpr = subexpr;
	    }
	}
      else if (subexpr->type != E_FALSE)
	{
	  subexpr->next = ret->subexpr;
	  ret->subexpr = subexpr;
	  answer = E_UNKNOWN;
	}
    }

  if (ret->subexpr == NULL)
    {
      parse_error(ls, "xor takes arguments!\n");
      return &false_bool_expr;   /* Default = FALSE */
    }

  if (answer == E_TRUE)
    return &true_bool_expr;
  else if (answer == E_FALSE)
    return &false_bool_expr;
  
  if (ret->subexpr->next == NULL && !odd_trues) /* (xor a) == a */
    return ret->subexpr;
  if (odd_trues)  /* If there were an odd number of TRUE's, toss one in. */
    {
      subexpr = create_bool_expr (E_TRUE, NULL);
      subexpr->next = ret->subexpr;
      ret->subexpr = subexpr;
    }
  
  return ret;
}